

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener_buffer.c
# Opt level: O3

void ht_listener_buffer_process_serialized_events
               (HT_ListenerBuffer *buffer,TEventPtr events,size_t size,
               HT_ListenerFlushCallback flush_callback,void *listener)

{
  ulong uVar1;
  ulong __n;
  size_t sVar2;
  
  if (size != 0) {
    sVar2 = buffer->usage;
    uVar1 = 0;
    do {
      __n = buffer->max_size - sVar2;
      if (size - uVar1 < __n) {
        __n = size - uVar1;
      }
      memcpy(buffer->data + sVar2,events + uVar1,__n);
      sVar2 = buffer->usage + __n;
      buffer->usage = sVar2;
      if (sVar2 == buffer->max_size) {
        (*flush_callback)(listener);
        buffer->usage = 0;
        sVar2 = 0;
      }
      uVar1 = uVar1 + __n;
    } while (uVar1 < size);
  }
  return;
}

Assistant:

void
ht_listener_buffer_process_serialized_events(HT_ListenerBuffer* buffer,
                                             TEventPtr events,
                                             size_t size,
                                             HT_ListenerFlushCallback flush_callback,
                                             void* listener)
{
    size_t written = 0;
    while (written < size)
    {
        size_t actual_size = HT_MIN(size - written, buffer->max_size - buffer->usage);
        memcpy(buffer->data + buffer->usage, events + written, actual_size);
        written += actual_size;
        buffer->usage+= actual_size;

        if (buffer->usage == buffer->max_size)
        {
            flush_callback(listener);
            buffer->usage = 0;
        }
    }
}